

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<Catch::TestRunInfo> * __thiscall
Catch::Option<Catch::TestRunInfo>::operator=
          (Option<Catch::TestRunInfo> *this,Option<Catch::TestRunInfo> *_other)

{
  type tVar1;
  Option<Catch::TestRunInfo> *in_RSI;
  Option<Catch::TestRunInfo> *in_RDI;
  TestRunInfo *in_stack_ffffffffffffffd8;
  Option<Catch::TestRunInfo> *in_stack_ffffffffffffffe0;
  char *this_00;
  
  reset(in_stack_ffffffffffffffe0);
  tVar1 = Catch::Option::operator_cast_to_function_pointer((Option<Catch::TestRunInfo> *)0x1bd447);
  if (tVar1 != 0) {
    this_00 = in_RDI->storage;
    operator*(in_RSI);
    TestRunInfo::TestRunInfo((TestRunInfo *)this_00,in_stack_ffffffffffffffd8);
    in_RDI->nullableValue = (TestRunInfo *)this_00;
  }
  return in_RDI;
}

Assistant:

Option& operator= ( Option const& _other ) {
            reset();
            if( _other )
                nullableValue = new( storage ) T( *_other );
            return *this;
        }